

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_integer_with_integer(void)

{
  undefined4 local_f8;
  type_conflict4 local_f4;
  undefined1 local_ef;
  undefined1 local_ee [2];
  uint local_ec;
  basic_variable<std::allocator<char>_> local_e8;
  undefined1 local_b8 [8];
  basic_variable<std::allocator<char>_> data_1;
  undefined1 local_7f;
  undefined1 local_7e [18];
  int local_6c;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_68,2);
  local_6c = 2;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_38,&local_68,&local_6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x97d,"void addition_suite::add_integer_with_integer()",local_7e,&local_7f);
  data_1.storage._44_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                 ((basic_variable<std::allocator<char>_> *)local_38);
  data_1.storage._40_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x97e,"void addition_suite::add_integer_with_integer()",&data_1.storage.field_0x2c,
             &data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_e8,2);
  local_ec = 2;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_b8,&local_e8,&local_ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  local_ee[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_b8);
  local_ef = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x982,"void addition_suite::add_integer_with_integer()",local_ee,&local_ef);
  local_f4 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                       ((basic_variable<std::allocator<char>_> *)local_b8);
  local_f8 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x983,"void addition_suite::add_integer_with_integer()",&local_f4,&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  return;
}

Assistant:

void add_integer_with_integer()
{
    {
        auto data = variable(2) + 2;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 4);
    }
    {
        auto data = variable(2) + 2U;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 4);
    }
}